

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_16_2_ed380826 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  puStack_30 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  local_78 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                       (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  sStack_70 = sysbvm_analysisEnvironment_setNewValueBinding
                        (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x10),0,local_78);
  sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding
            (context,arguments[1],sStack_70);
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUseNamedSlotsOfNode_t **useNode = (sysbvm_astUseNamedSlotsOfNode_t**)node;

    struct {
        sysbvm_tuple_t usedTuple;
        sysbvm_tuple_t localBinding;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*useNode)->super.sourcePosition);

    gcFrame.usedTuple = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*useNode)->tupleExpression, *environment);
    gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, (*useNode)->super.sourcePosition, SYSBVM_NULL_TUPLE, gcFrame.usedTuple);
    sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(context, *environment, gcFrame.localBinding);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return SYSBVM_VOID_TUPLE;
}